

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O2

BasicMutSuffix<int> __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name,int kind,int num_values,
          SuffixTable *table)

{
  BasicSuffix<int> BVar1;
  int *piVar2;
  AssertionFailure *this_00;
  
  if ((kind & 4U) == 0) {
    BVar1.super_SuffixBase.impl_ = (SuffixBase)DoAdd(this,name,kind,num_values,table);
    if (num_values != 0) {
      piVar2 = Allocate<int>(this,(long)num_values);
      std::__fill_n_a<int*,int,int>(piVar2,num_values);
      ((anon_union_8_3_3627ffa1_for_Impl_3 *)((long)BVar1.super_SuffixBase.impl_ + 0x18))->
      int_values = piVar2;
    }
    return (BasicMutSuffix<int>)(Impl *)BVar1.super_SuffixBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid suffix kind");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BasicMutSuffix<T> Add(fmt::StringRef name, int kind, int num_values,
                        const SuffixTable& table = {}) {
    MP_ASSERT((kind & suf::FLOAT) == 0 ||
              (kind & suf::FLOAT) == internal::SuffixInfo<T>::KIND,
              "invalid suffix kind");
    SuffixImpl *impl = DoAdd(
          name, kind | internal::SuffixInfo<T>::KIND, num_values, table);
    if (num_values != 0) {
      T *values = Allocate<T>(num_values);
      std::fill_n(fmt::internal::make_ptr(values, num_values), num_values, 0);
      impl->values = values;
    }
    return BasicMutSuffix<T>(impl);
  }